

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_flush(connectdata *conn)

{
  size_t len_00;
  CURLcode result;
  ssize_t len;
  ssize_t bytes_written;
  smb_conn *smbc;
  connectdata *conn_local;
  
  bytes_written = (ssize_t)&conn->proto;
  len_00 = (conn->proto).ftpc.pp.response.tv_sec - (conn->proto).smbc.sent;
  if ((conn->proto).ftpc.pp.response.tv_sec == 0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    smbc = (smb_conn *)conn;
    conn_local._4_4_ =
         Curl_write(conn,0,(conn->data->state).ulbuf +
                           *(long *)&(conn->proto).ftpc.pp.response.tv_usec,len_00,&len);
    if (conn_local._4_4_ == CURLE_OK) {
      if (len == len_00) {
        *(undefined8 *)(bytes_written + 0x40) = 0;
      }
      else {
        *(ssize_t *)(bytes_written + 0x48) = len + *(long *)(bytes_written + 0x48);
      }
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_flush(struct connectdata *conn)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  ssize_t bytes_written;
  ssize_t len = smbc->send_size - smbc->sent;
  CURLcode result;

  if(!smbc->send_size)
    return CURLE_OK;

  result = Curl_write(conn, FIRSTSOCKET,
                      conn->data->state.ulbuf + smbc->sent,
                      len, &bytes_written);
  if(result)
    return result;

  if(bytes_written != len)
    smbc->sent += bytes_written;
  else
    smbc->send_size = 0;

  return CURLE_OK;
}